

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatastream.h
# Opt level: O0

bool QDataStream::writeQSizeType(QDataStream *s,qint64 value)

{
  int iVar1;
  QDataStream *this;
  long in_RSI;
  QDataStream *in_RDI;
  quint32 i;
  
  i = (quint32)((ulong)in_RSI >> 0x20);
  if (in_RSI < 0xfffffffe) {
    operator<<(in_RDI,i);
  }
  else {
    iVar1 = version(in_RDI);
    if (iVar1 < 0x16) {
      if (in_RSI != 0xfffffffe) {
        QDataStream::setStatus((Status)in_RDI);
        return false;
      }
      operator<<(in_RDI,i);
    }
    else {
      this = operator<<(in_RDI,i);
      QDataStream::operator<<(this,in_RSI);
    }
  }
  return true;
}

Assistant:

bool QDataStream::writeQSizeType(QDataStream &s, qint64 value)
{
    if (value < qint64(ExtendedSize)) {
        s << quint32(value);
    } else if (s.version() >= QDataStream::Qt_6_7) {
        s << ExtendedSize << value;
    } else if (value == qint64(ExtendedSize)) {
        s << ExtendedSize;
    } else {
        s.setStatus(QDataStream::SizeLimitExceeded); // value is too big for old format
        return false;
    }
    return true;
}